

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O2

void __thiscall
o3dgc::Arithmetic_Codec::encode(Arithmetic_Codec *this,uint data,Static_Data_Model *M)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = this->base;
  uVar3 = this->length >> 0xf;
  uVar2 = M->distribution[data];
  if (M->last_symbol == data) {
    uVar4 = uVar3 * uVar2 + uVar1;
    this->base = uVar4;
    uVar3 = this->length - uVar3 * uVar2;
  }
  else {
    this->length = uVar3;
    uVar4 = uVar3 * uVar2 + uVar1;
    this->base = uVar4;
    uVar3 = (M->distribution[data + 1] - uVar2) * uVar3;
  }
  this->length = uVar3;
  if (uVar4 < uVar1) {
    propagate_carry(this);
    uVar3 = this->length;
  }
  if (uVar3 < 0x1000000) {
    renorm_enc_interval(this);
    return;
  }
  return;
}

Assistant:

void Arithmetic_Codec::encode(unsigned data,
                                  Static_Data_Model & M)
    {
    #ifdef _DEBUG
      if (mode != 1) AC_Error("encoder not initialized");
      if (data >= M.data_symbols) AC_Error("invalid data symbol");
    #endif

      unsigned x, init_base = base;
                                                               // compute products
      if (data == M.last_symbol) {
        x = M.distribution[data] * (length >> DM__LengthShift);
        base   += x;                                            // update interval
        length -= x;                                          // no product needed
      }
      else {
        x = M.distribution[data] * (length >>= DM__LengthShift);
        base   += x;                                            // update interval
        length  = M.distribution[data+1] * length - x;
      }
             
      if (init_base > base) propagate_carry();                 // overflow = carry

      if (length < AC__MinLength) renorm_enc_interval();        // renormalization
    }